

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O1

int uttamarin::EditDistanceHelper
              (string *A,int a,string *B,int b,
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *dp)

{
  char cVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_type sVar6;
  size_type sVar7;
  
  sVar6 = (size_type)a;
  if (A->_M_string_length == sVar6) {
    iVar3 = (int)B->_M_string_length - b;
  }
  else {
    sVar7 = (size_type)b;
    if (B->_M_string_length == sVar7) {
      iVar3 = (int)A->_M_string_length - a;
    }
    else {
      if (*(int *)(*(long *)&(dp->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[sVar6].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + sVar7 * 4) == -1) {
        iVar4 = EditDistanceHelper(A,a,B,b + 1,dp);
        iVar5 = EditDistanceHelper(A,a + 1,B,b,dp);
        cVar1 = (A->_M_dataplus)._M_p[sVar6];
        cVar2 = (B->_M_dataplus)._M_p[sVar7];
        iVar3 = EditDistanceHelper(A,a + 1,B,b + 1,dp);
        iVar3 = iVar3 + (uint)(cVar1 != cVar2);
        if (iVar5 < iVar3) {
          iVar3 = iVar5 + 1;
        }
        if (iVar4 + 1 <= iVar3) {
          iVar3 = iVar4 + 1;
        }
        *(int *)(*(long *)&(dp->
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[sVar6].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data + sVar7 * 4) = iVar3;
      }
      iVar3 = *(int *)(*(long *)&(dp->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[sVar6].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + sVar7 * 4);
    }
  }
  return iVar3;
}

Assistant:

int EditDistanceHelper(const string& A, int a, const string& B, int b,
                       vector<vector<int>>& dp) { 
  if(a == A.size()) return B.size() - b; 
  if(b == B.size()) return A.size() - a; 
  if(dp[a][b] == -1) { 
    int add = 1 + EditDistanceHelper(A, a, B, b+1, dp); 
    int remove = 1 + EditDistanceHelper(A, a+1, B, b, dp); 
    int modification_cost = A[a] == B[b] ? 0 : 1; 
    int keep_or_modify = modification_cost + 
      EditDistanceHelper(A, a+1, B, b+1, dp); 
    dp[a][b] = std::min(add, std::min(remove, keep_or_modify)); 
  } 
  return dp[a][b]; 
}